

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleTestApprovals.h
# Opt level: O0

void __thiscall
ApprovalTests::GoogleTestListener::OnTestStart(GoogleTestListener *this,TestInfo *testInfo)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 uVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  string *psVar5;
  long in_RDI;
  TestName *in_stack_fffffffffffffe90;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  iterator in_stack_fffffffffffffea8;
  TestName *in_stack_fffffffffffffeb0;
  allocator *paVar6;
  undefined6 in_stack_fffffffffffffec0;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  GoogleTestListener *in_stack_ffffffffffffff18;
  allocator local_c9;
  string local_c8 [32];
  char *local_a8;
  allocator local_99;
  string local_98 [32];
  string local_78 [32];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58 [2];
  allocator local_31;
  string local_30 [48];
  
  pcVar4 = testing::TestInfo::file((TestInfo *)0x11131a);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,pcVar4,&local_31);
  TestName::setFileName(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ::std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(local_58);
  __l._M_len = (size_type)in_stack_fffffffffffffeb0;
  __l._M_array = in_stack_fffffffffffffea8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),__l);
  psVar5 = TestName::getFileName_abi_cxx11_(in_stack_fffffffffffffe90);
  ::std::__cxx11::string::string(local_78,(string *)psVar5);
  pcVar4 = testing::TestInfo::test_case_name((TestInfo *)0x1113cf);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_98,pcVar4,&local_99);
  uVar1 = isDuplicate(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08)
  ;
  bVar2 = uVar1 ^ 0xff;
  ::std::__cxx11::string::~string(local_98);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
  ::std::__cxx11::string::~string(local_78);
  if ((bVar2 & 1) != 0) {
    local_a8 = testing::TestInfo::test_case_name((TestInfo *)0x11147a);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (char **)in_stack_fffffffffffffe98);
  }
  pcVar4 = testing::TestInfo::name((TestInfo *)0x11155b);
  paVar6 = &local_c9;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_c8,pcVar4,paVar6);
  bVar3 = ::std::__cxx11::string::empty();
  bVar3 = bVar3 ^ 0xff;
  ::std::__cxx11::string::~string(local_c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if ((bVar3 & 1) != 0) {
    in_stack_fffffffffffffe98 = (anon_class_1_0_00000001 *)(in_RDI + 8);
    testing::TestInfo::name((TestInfo *)0x1115dd);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(bVar3,in_stack_fffffffffffffea0),(char **)in_stack_fffffffffffffe98);
  }
  FrameworkIntegrations::setCurrentTest((TestName *)0x11162a);
  ::std::function<void()>::
  function<ApprovalTests::GoogleTestListener::OnTestStart(testing::TestInfo_const&)::_lambda()_1_,void>
            ((function<void_()> *)CONCAT17(bVar3,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98);
  FrameworkIntegrations::setTestPassedNotification
            ((TestPassedNotification *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffec0)));
  ::std::function<void_()>::~function((function<void_()> *)0x11165a);
  return;
}

Assistant:

virtual void OnTestStart(const testing::TestInfo& testInfo) override
        {
            currentTest.setFileName(testInfo.file());
            currentTest.sections = {};
            if (!isDuplicate(currentTest.getFileName(), testInfo.test_case_name()))
            {
                currentTest.sections.emplace_back(testInfo.test_case_name());
            }
            if (!std::string(testInfo.name()).empty())
            {
                currentTest.sections.emplace_back(testInfo.name());
            }

            ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
            ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                []() { EXPECT_TRUE(true); });
        }